

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O1

void deqp::gles2::Functional::invalidTex2DAttachmentTest(TestContext *testCtx,Context *context)

{
  deUint32 tex2D;
  uint local_1c;
  
  (*context->_vptr_Context[9])(context,0x8d40,1);
  logComment(testCtx,"Attaching 2D texture using GL_TEXTURE_CUBE_MAP_NEGATIVE_X texture target");
  local_1c = 1;
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0x8516,(ulong)local_1c,0);
  checkError(testCtx,context,0x502);
  logComment(testCtx,"Attaching deleted 2D texture object");
  (*context->_vptr_Context[8])(context,1,&local_1c);
  (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)local_1c,0);
  checkError(testCtx,context,0x502);
  return;
}

Assistant:

static void invalidTex2DAttachmentTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	logComment(testCtx, "Attaching 2D texture using GL_TEXTURE_CUBE_MAP_NEGATIVE_X texture target");

	deUint32 tex2D = 1;
	context.bindTexture(GL_TEXTURE_2D, tex2D);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_NEGATIVE_X, tex2D, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);

	logComment(testCtx, "Attaching deleted 2D texture object");
	context.deleteTextures(1, &tex2D);
	context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex2D, 0);
	checkError(testCtx, context, GL_INVALID_OPERATION);
}